

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

TVMType __thiscall tvm::runtime::TVMArgValue::operator_cast_to_DLDataType(TVMArgValue *this)

{
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  char *pcVar4;
  LogMessageFatal local_1e0;
  anon_enum_32 local_54;
  LogCheckError local_50;
  LogCheckError _check_err;
  string local_38;
  TVMArgValue *local_18;
  TVMArgValue *this_local;
  TVMType t;
  
  local_18 = this;
  if ((this->super_TVMPODValue_).type_code_ == 0xb) {
    operator_cast_to_string(&local_38,this);
    this_local._4_4_ = String2TVMType(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if ((this->super_TVMPODValue_).type_code_ == 4) {
    this_local._4_1_ = '\x03';
    this_local._5_1_ = '\0';
    this_local._6_2_ = 0;
  }
  else {
    local_54 = kTVMType;
    dmlc::LogCheck_EQ<int,TVMTypeCode>
              ((dmlc *)&local_50,&(this->super_TVMPODValue_).type_code_,&local_54);
    bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_50);
    if (bVar1) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x23d);
      poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1e0);
      poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"type_code_ == kTVMType");
      poVar3 = std::operator<<(poVar3,(string *)local_50.str);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3," expected ");
      pcVar4 = TypeCode2Str(5);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3," but get ");
      pcVar4 = TypeCode2Str((this->super_TVMPODValue_).type_code_);
      std::operator<<(poVar3,pcVar4);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1e0);
    }
    dmlc::LogCheckError::~LogCheckError(&local_50);
    this_local._4_4_ = (this->super_TVMPODValue_).value_.v_type;
  }
  return this_local._4_4_;
}

Assistant:

operator TVMType() const {
    if (type_code_ == kStr) {
      return String2TVMType(operator std::string());
    }
    // None type
    if (type_code_ == kNull) {
      TVMType t;
      t.code = kHandle;
      t.bits = 0;
      t.lanes = 0;
      return t;
    }
    TVM_CHECK_TYPE_CODE(type_code_, kTVMType);
    return value_.v_type;
  }